

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tty.c
# Opt level: O3

wchar_t tty_stty(EditLine *el,wchar_t argc,wchar_t **argv)

{
  termios *ptVar1;
  int iVar2;
  uint uVar3;
  anon_struct_16_3_f1fa40e6 *paVar4;
  wchar_t *pwVar5;
  cc_t cVar6;
  char *pcVar8;
  size_t sVar9;
  termios *t;
  char *pcVar10;
  ttymodes_t *ptVar11;
  uint *puVar12;
  int iVar13;
  long lVar14;
  wchar_t *__wcs;
  uint uVar15;
  wchar_t **ppwVar16;
  ulong uVar17;
  wchar_t *p;
  char name [1024];
  ulong local_470;
  ulong local_468;
  size_t local_458;
  wchar_t *local_448;
  long local_440;
  char local_438 [1032];
  wchar_t wVar7;
  
  if (argv == (wchar_t **)0x0) {
    return L'\xffffffff';
  }
  pcVar8 = ct_encode_string(*argv,&el->el_scratch);
  strlcpy(local_438,pcVar8,0x400);
  __wcs = argv[1];
  local_470 = 0;
  if (__wcs == (wchar_t *)0x0) {
    uVar17 = 0;
  }
  else {
    ptVar1 = &(el->el_tty).t_ex;
    ppwVar16 = argv + 1;
    iVar13 = 0;
    t = ptVar1;
    do {
      if ((*__wcs != L'-') || (__wcs[2] != L'\0')) {
        local_440 = local_470 * 0x50;
        goto LAB_00113243;
      }
      wVar7 = __wcs[1];
      if (wVar7 < L'q') {
        if (wVar7 == L'a') {
          iVar13 = iVar13 + 1;
        }
        else {
          if (wVar7 != L'd') {
LAB_00113646:
            fprintf((FILE *)el->el_errfile,"%s: Unknown switch `%lc\'.\n",local_438);
            return L'\xffffffff';
          }
          local_470 = 1;
          t = &(el->el_tty).t_ed;
        }
      }
      else if (wVar7 == L'q') {
        local_470 = 2;
        t = &(el->el_tty).t_ts;
      }
      else {
        local_470 = 0;
        t = ptVar1;
        if (wVar7 != L'x') goto LAB_00113646;
      }
      __wcs = ppwVar16[1];
      ppwVar16 = ppwVar16 + 1;
    } while (__wcs != (wchar_t *)0x0);
    uVar17 = local_470;
    local_470 = (ulong)(iVar13 != 0);
  }
  iVar13 = -1;
  pcVar8 = "ignbrk";
  ptVar11 = ttymodes;
  local_468 = 0;
  local_458 = 0;
  do {
    ptVar11 = ptVar11 + 1;
    iVar2 = ptVar11[-1].m_type;
    if (iVar2 != iVar13) {
      pcVar10 = "\n";
      if (iVar13 == -1) {
        pcVar10 = "";
      }
      fprintf((FILE *)el->el_outfile,"%s%s",pcVar10,(el->el_tty).t_t[uVar17][iVar2].t_name);
      local_468 = strlen((el->el_tty).t_t[uVar17][iVar2].t_name);
      iVar13 = iVar2;
      local_458 = local_468;
    }
    if (iVar13 == -1) {
      uVar15 = 0;
    }
    else {
      uVar15 = (el->el_tty).t_t[uVar17][iVar13].t_setmask & ptVar11[-1].m_value;
      if (uVar15 != 0) {
        uVar15 = 0x2b;
      }
      if (((el->el_tty).t_t[uVar17][iVar13].t_clrmask & ptVar11[-1].m_value) != 0) {
        uVar15 = 0x2d;
      }
    }
    if (uVar15 != 0 || local_470 != 0) {
      sVar9 = strlen(pcVar8);
      lVar14 = (sVar9 + 1) - (ulong)(uVar15 == 0);
      local_458 = local_458 + lVar14 + 1;
      if ((ulong)(long)(el->el_terminal).t_size.h <= local_458) {
        local_440 = CONCAT44(local_440._4_4_,iVar13);
        fprintf((FILE *)el->el_outfile,"\n%*s",local_468 & 0xffffffff,"");
        local_458 = lVar14 + 1 + local_468;
        iVar13 = (int)local_440;
      }
      if (uVar15 == 0) {
        fprintf((FILE *)el->el_outfile,"%s ",pcVar8);
      }
      else {
        fprintf((FILE *)el->el_outfile,"%c%s ",(ulong)uVar15,pcVar8);
      }
    }
    pcVar8 = ptVar11->m_name;
  } while (pcVar8 != (char *)0x0);
  fputc(10,(FILE *)el->el_outfile);
  return L'\0';
LAB_00113243:
  ptVar11 = ttymodes;
  wVar7 = *__wcs;
  if ((wVar7 == L'-') || (wVar7 == L'+')) {
    __wcs = __wcs + 1;
  }
  else {
    wVar7 = L'\0';
  }
  ppwVar16 = ppwVar16 + 1;
  local_448 = wcschr(__wcs,L'=');
  pcVar8 = "ignbrk";
  do {
    pwVar5 = local_448;
    ptVar11 = ptVar11 + 1;
    pcVar10 = ct_encode_string(__wcs,&el->el_scratch);
    if (pwVar5 == (wchar_t *)0x0) {
      iVar13 = strcmp(pcVar8,pcVar10);
    }
    else {
      iVar13 = strncmp(pcVar8,pcVar10,(long)local_448 - (long)__wcs >> 2);
    }
    if (iVar13 == 0) {
      if (local_448 == (wchar_t *)0x0) {
        uVar15 = ptVar11[-1].m_value;
        if (wVar7 == L'-') {
          iVar13 = ptVar11[-1].m_type;
          puVar12 = &(el->el_tty).t_t[local_470][iVar13].t_setmask;
          *puVar12 = *puVar12 & ~uVar15;
          puVar12 = &(el->el_tty).t_t[local_470][iVar13].t_clrmask;
          *puVar12 = *puVar12 | uVar15;
        }
        else if (wVar7 == L'+') {
          iVar13 = ptVar11[-1].m_type;
          puVar12 = &(el->el_tty).t_t[local_470][iVar13].t_setmask;
          *puVar12 = *puVar12 | uVar15;
          puVar12 = &(el->el_tty).t_t[local_470][iVar13].t_clrmask;
          *puVar12 = *puVar12 & ~uVar15;
        }
        else {
          paVar4 = (el->el_tty).t_t[local_470] + ptVar11[-1].m_type;
          uVar17._0_4_ = paVar4->t_setmask;
          uVar17._4_4_ = paVar4->t_clrmask;
          uVar17 = CONCAT44(~uVar15,~uVar15) & uVar17;
          paVar4 = (el->el_tty).t_t[local_470] + ptVar11[-1].m_type;
          paVar4->t_setmask = (int)uVar17;
          paVar4->t_clrmask = (int)(uVar17 >> 0x20);
        }
        goto LAB_001133d1;
      }
      if (ptVar11[-1].m_type == 4) break;
    }
    pcVar8 = ptVar11->m_name;
    if (pcVar8 == (char *)0x0) {
      fprintf((FILE *)el->el_errfile,"%s: Invalid argument `%ls\'.\n",local_438,__wcs);
      return L'\xffffffff';
    }
  } while( true );
  uVar15 = ptVar11[-1].m_value;
  if (local_448[1] == L'\0') {
    cVar6 = (el->el_tty).t_vdisable;
    local_448 = local_448 + 1;
  }
  else {
    local_448 = local_448 + 1;
    wVar7 = parse__escape(&local_448);
    cVar6 = (cc_t)wVar7;
  }
  if (uVar15 == 0) {
    __assert_fail("c != 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/ksherlock[P]libedit/src/tty.c",
                  0x4f7,"int tty_stty(EditLine *, int, const wchar_t **)");
  }
  uVar3 = 0;
  if (uVar15 != 0) {
    for (; (uVar15 >> uVar3 & 1) == 0; uVar3 = uVar3 + 1) {
    }
  }
  if ((0x18 < uVar3) || ((0x183bc7fU >> (uVar3 & 0x1f) & 1) == 0)) {
    __assert_fail("c != -1",
                  "/workspace/llm4binary/github/license_c_cmakelists/ksherlock[P]libedit/src/tty.c",
                  0x4fa,"int tty_stty(EditLine *, int, const wchar_t **)");
  }
  t->c_cc[(&DAT_00121f68)[uVar3]] = cVar6;
LAB_001133d1:
  __wcs = *ppwVar16;
  if (__wcs == (wchar_t *)0x0) {
    puVar12 = (uint *)((long)&(el->el_tty).t_t[0][0].t_clrmask + local_440);
    lVar14 = 0;
    do {
      t->c_iflag = ~*puVar12 & t->c_iflag | puVar12[-1];
      lVar14 = lVar14 + 1;
      puVar12 = puVar12 + 4;
    } while (lVar14 != 4);
    if ((uint)local_470 != (el->el_tty).t_mode) {
      return L'\0';
    }
    wVar7 = tty_setty(el,L'\x01',t);
    if (wVar7 != L'\xffffffff') {
      return L'\0';
    }
    return L'\xffffffff';
  }
  goto LAB_00113243;
}

Assistant:

libedit_private int
/*ARGSUSED*/
tty_stty(EditLine *el, int argc __attribute__((__unused__)),
    const wchar_t **argv)
{
	const ttymodes_t *m;
	char x;
	int aflag = 0;
	const wchar_t *s, *d;
        char name[EL_BUFSIZ];
	struct termios *tios = &el->el_tty.t_ex;
	int z = EX_IO;

	if (argv == NULL)
		return -1;
	strlcpy(name, ct_encode_string(*argv++, &el->el_scratch), sizeof(name));

	while (argv && *argv && argv[0][0] == '-' && argv[0][2] == '\0')
		switch (argv[0][1]) {
		case 'a':
			aflag++;
			argv++;
			break;
		case 'd':
			argv++;
			tios = &el->el_tty.t_ed;
			z = ED_IO;
			break;
		case 'x':
			argv++;
			tios = &el->el_tty.t_ex;
			z = EX_IO;
			break;
		case 'q':
			argv++;
			tios = &el->el_tty.t_ts;
			z = QU_IO;
			break;
		default:
			(void) fprintf(el->el_errfile,
			    "%s: Unknown switch `%lc'.\n",
			    name, (wint_t)argv[0][1]);
			return -1;
		}

	if (!argv || !*argv) {
		int i = -1;
		size_t len = 0, st = 0, cu;
		for (m = ttymodes; m->m_name; m++) {
			if (m->m_type != i) {
				(void) fprintf(el->el_outfile, "%s%s",
				    i != -1 ? "\n" : "",
				    el->el_tty.t_t[z][m->m_type].t_name);
				i = m->m_type;
				st = len =
				    strlen(el->el_tty.t_t[z][m->m_type].t_name);
			}
			if (i != -1) {
			    x = (el->el_tty.t_t[z][i].t_setmask & m->m_value)
				?  '+' : '\0';

			    if (el->el_tty.t_t[z][i].t_clrmask & m->m_value)
				x = '-';
			} else {
			    x = '\0';
			}

			if (x != '\0' || aflag) {

				cu = strlen(m->m_name) + (x != '\0') + 1;

				if (len + cu >=
				    (size_t)el->el_terminal.t_size.h) {
					(void) fprintf(el->el_outfile, "\n%*s",
					    (int)st, "");
					len = st + cu;
				} else
					len += cu;

				if (x != '\0')
					(void) fprintf(el->el_outfile, "%c%s ",
					    x, m->m_name);
				else
					(void) fprintf(el->el_outfile, "%s ",
					    m->m_name);
			}
		}
		(void) fprintf(el->el_outfile, "\n");
		return 0;
	}
	while (argv && (s = *argv++)) {
		const wchar_t *p;
		switch (*s) {
		case '+':
		case '-':
			x = (char)*s++;
			break;
		default:
			x = '\0';
			break;
		}
		d = s;
		p = wcschr(s, L'=');
		for (m = ttymodes; m->m_name; m++)
			if ((p ? strncmp(m->m_name, ct_encode_string(d,
			    &el->el_scratch), (size_t)(p - d)) :
			    strcmp(m->m_name, ct_encode_string(d,
			    &el->el_scratch))) == 0 &&
			    (p == NULL || m->m_type == MD_CHAR))
				break;

		if (!m->m_name) {
			(void) fprintf(el->el_errfile,
			    "%s: Invalid argument `%ls'.\n", name, d);
			return -1;
		}
		if (p) {
			int c = ffs((int)m->m_value);
			int v = *++p ? parse__escape(&p) :
			    el->el_tty.t_vdisable;
			assert(c != 0);
			c--;
			c = tty__getcharindex(c);
			assert(c != -1);
			tios->c_cc[c] = (cc_t)v;
			continue;
		}
		switch (x) {
		case '+':
			el->el_tty.t_t[z][m->m_type].t_setmask |= m->m_value;
			el->el_tty.t_t[z][m->m_type].t_clrmask &= ~m->m_value;
			break;
		case '-':
			el->el_tty.t_t[z][m->m_type].t_setmask &= ~m->m_value;
			el->el_tty.t_t[z][m->m_type].t_clrmask |= m->m_value;
			break;
		default:
			el->el_tty.t_t[z][m->m_type].t_setmask &= ~m->m_value;
			el->el_tty.t_t[z][m->m_type].t_clrmask &= ~m->m_value;
			break;
		}
	}

	tty_setup_flags(el, tios, z);
	if (el->el_tty.t_mode == z) {
		if (tty_setty(el, TCSADRAIN, tios) == -1) {
#ifdef DEBUG_TTY
			(void) fprintf(el->el_errfile, "%s: tty_setty: %s\n",
			    __func__, strerror(errno));
#endif /* DEBUG_TTY */
			return -1;
		}
	}

	return 0;
}